

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# maybe.hpp
# Opt level: O0

maybe<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void> *
__thiscall
pstore::maybe<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>
::operator=(maybe<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>
            *this,maybe<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>
                  *other)

{
  bool bVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *other_00;
  maybe<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>
  *other_local;
  maybe<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>
  *this_local;
  
  if (other != this) {
    bVar1 = has_value(other);
    if (bVar1) {
      other_00 = value(other);
      maybe<std::__cxx11::string,void>::operator=((maybe<std::__cxx11::string,void> *)this,other_00)
      ;
    }
    else {
      reset(this);
    }
  }
  return this;
}

Assistant:

maybe &
        operator= (maybe && other) noexcept (std::is_nothrow_move_assignable<T>::value &&
                                                 std::is_nothrow_move_constructible<T>::value) {

            if (&other != this) {
                if (!other.has_value ()) {
                    this->reset ();
                } else {
                    this->operator= (std::forward<T> (other.value ()));
                }
            }
            return *this;
        }